

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

bool __thiscall
SQFunctionProto::Save(SQFunctionProto *this,SQVM *v,SQUserPointer up,SQWRITEFUNC write)

{
  undefined8 *puVar1;
  SQLocalVarInfo *pSVar2;
  bool bVar3;
  SQObjectPtr *o;
  SQUserPointer dest;
  long lVar4;
  long lVar5;
  long local_80;
  long local_78;
  SQInteger ndefaultparams;
  SQInteger nfunctions;
  SQInteger ninstructions;
  SQInteger nlineinfos;
  SQInteger nlocalvarinfos;
  SQInteger noutervalues;
  SQInteger nparameters;
  SQInteger nliterals;
  
  nliterals = this->_nliterals;
  nparameters = this->_nparameters;
  noutervalues = this->_noutervalues;
  nlocalvarinfos = this->_nlocalvarinfos;
  nlineinfos = this->_nlineinfos;
  ninstructions = this->_ninstructions;
  nfunctions = this->_nfunctions;
  ndefaultparams = this->_ndefaultparams;
  bVar3 = WriteTag(v,write,up,0x50415254);
  if ((((((bVar3) && (bVar3 = WriteObject(v,up,write,&this->_sourcename), bVar3)) &&
        (bVar3 = WriteObject(v,up,write,&this->_name), bVar3)) &&
       ((bVar3 = WriteTag(v,write,up,0x50415254), bVar3 &&
        (bVar3 = SafeWrite(v,write,up,&nliterals,8), bVar3)))) &&
      ((bVar3 = SafeWrite(v,write,up,&nparameters,8), bVar3 &&
       ((bVar3 = SafeWrite(v,write,up,&noutervalues,8), bVar3 &&
        (bVar3 = SafeWrite(v,write,up,&nlocalvarinfos,8), bVar3)))))) &&
     ((bVar3 = SafeWrite(v,write,up,&nlineinfos,8), bVar3 &&
      ((((bVar3 = SafeWrite(v,write,up,&ndefaultparams,8), bVar3 &&
         (bVar3 = SafeWrite(v,write,up,&ninstructions,8), bVar3)) &&
        (bVar3 = SafeWrite(v,write,up,&nfunctions,8), bVar3)) &&
       (bVar3 = WriteTag(v,write,up,0x50415254), bVar3)))))) {
    lVar4 = -1;
    lVar5 = 0;
    while (lVar4 = lVar4 + 1, lVar4 < nliterals) {
      bVar3 = WriteObject(v,up,write,
                          (SQObjectPtr *)((long)&(this->_literals->super_SQObject)._type + lVar5));
      lVar5 = lVar5 + 0x10;
      if (!bVar3) {
        return false;
      }
    }
    bVar3 = WriteTag(v,write,up,0x50415254);
    if (bVar3) {
      lVar4 = -1;
      lVar5 = 0;
      while (lVar4 = lVar4 + 1, lVar4 < nparameters) {
        bVar3 = WriteObject(v,up,write,
                            (SQObjectPtr *)
                            ((long)&(this->_parameters->super_SQObject)._type + lVar5));
        lVar5 = lVar5 + 0x10;
        if (!bVar3) {
          return false;
        }
      }
      bVar3 = WriteTag(v,write,up,0x50415254);
      if (bVar3) {
        lVar4 = -1;
        lVar5 = 0;
        while (lVar4 = lVar4 + 1, lVar4 < noutervalues) {
          bVar3 = SafeWrite(v,write,up,(SQUserPointer)((long)&this->_outervalues->_type + lVar5),8);
          if (!bVar3) {
            return false;
          }
          bVar3 = WriteObject(v,up,write,
                              (SQObjectPtr *)
                              ((long)&(this->_outervalues->_src).super_SQObject._type + lVar5));
          if (!bVar3) {
            return false;
          }
          o = (SQObjectPtr *)((long)&(this->_outervalues->_name).super_SQObject._type + lVar5);
          lVar5 = lVar5 + 0x28;
          bVar3 = WriteObject(v,up,write,o);
          if (!bVar3) {
            return false;
          }
        }
        bVar3 = WriteTag(v,write,up,0x50415254);
        if (bVar3) {
          local_78 = -1;
          lVar4 = 0;
          local_80 = 8;
          while (local_78 = local_78 + 1, local_78 < nlocalvarinfos) {
            pSVar2 = this->_localvarinfos;
            bVar3 = WriteObject(v,up,write,
                                (SQObjectPtr *)((long)&(pSVar2->_name).super_SQObject._type + lVar4)
                               );
            if (!bVar3) {
              return false;
            }
            bVar3 = SafeWrite(v,write,up,(SQUserPointer)((long)&pSVar2->_pos + lVar4),8);
            if (!bVar3) {
              return false;
            }
            bVar3 = SafeWrite(v,write,up,(SQUserPointer)((long)&pSVar2->_start_op + lVar4),8);
            if (!bVar3) {
              return false;
            }
            dest = (SQUserPointer)((long)&pSVar2->_end_op + lVar4);
            lVar4 = lVar4 + 0x28;
            bVar3 = SafeWrite(v,write,up,dest,8);
            if (!bVar3) {
              return false;
            }
          }
          bVar3 = WriteTag(v,write,up,0x50415254);
          if (((((bVar3) && (bVar3 = SafeWrite(v,write,up,this->_lineinfos,nlineinfos << 4), bVar3))
               && ((bVar3 = WriteTag(v,write,up,0x50415254), bVar3 &&
                   ((bVar3 = SafeWrite(v,write,up,this->_defaultparams,ndefaultparams << 3), bVar3
                    && (bVar3 = WriteTag(v,write,up,0x50415254), bVar3)))))) &&
              (bVar3 = SafeWrite(v,write,up,this->_instructions,ninstructions << 3), bVar3)) &&
             (bVar3 = WriteTag(v,write,up,0x50415254), bVar3)) {
            lVar4 = -1;
            while (lVar4 = lVar4 + 1, lVar4 < nfunctions) {
              puVar1 = (undefined8 *)((long)&(this->_functions->super_SQObject)._type + local_80);
              local_80 = local_80 + 0x10;
              bVar3 = Save((SQFunctionProto *)*puVar1,v,up,write);
              if (!bVar3) {
                return false;
              }
            }
            bVar3 = SafeWrite(v,write,up,&this->_stacksize,8);
            if ((bVar3) && (bVar3 = SafeWrite(v,write,up,&this->_bgenerator,1), bVar3)) {
              bVar3 = SafeWrite(v,write,up,&this->_varparams,8);
              return bVar3;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool SQFunctionProto::Save(SQVM *v,SQUserPointer up,SQWRITEFUNC write)
{
    SQInteger i,nliterals = _nliterals,nparameters = _nparameters;
    SQInteger noutervalues = _noutervalues,nlocalvarinfos = _nlocalvarinfos;
    SQInteger nlineinfos=_nlineinfos,ninstructions = _ninstructions,nfunctions=_nfunctions;
    SQInteger ndefaultparams = _ndefaultparams;
    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(WriteObject(v,up,write,_sourcename));
    _CHECK_IO(WriteObject(v,up,write,_name));
    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeWrite(v,write,up,&nliterals,sizeof(nliterals)));
    _CHECK_IO(SafeWrite(v,write,up,&nparameters,sizeof(nparameters)));
    _CHECK_IO(SafeWrite(v,write,up,&noutervalues,sizeof(noutervalues)));
    _CHECK_IO(SafeWrite(v,write,up,&nlocalvarinfos,sizeof(nlocalvarinfos)));
    _CHECK_IO(SafeWrite(v,write,up,&nlineinfos,sizeof(nlineinfos)));
    _CHECK_IO(SafeWrite(v,write,up,&ndefaultparams,sizeof(ndefaultparams)));
    _CHECK_IO(SafeWrite(v,write,up,&ninstructions,sizeof(ninstructions)));
    _CHECK_IO(SafeWrite(v,write,up,&nfunctions,sizeof(nfunctions)));
    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<nliterals;i++){
        _CHECK_IO(WriteObject(v,up,write,_literals[i]));
    }

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<nparameters;i++){
        _CHECK_IO(WriteObject(v,up,write,_parameters[i]));
    }

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<noutervalues;i++){
        _CHECK_IO(SafeWrite(v,write,up,&_outervalues[i]._type,sizeof(SQUnsignedInteger)));
        _CHECK_IO(WriteObject(v,up,write,_outervalues[i]._src));
        _CHECK_IO(WriteObject(v,up,write,_outervalues[i]._name));
    }

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<nlocalvarinfos;i++){
        SQLocalVarInfo &lvi=_localvarinfos[i];
        _CHECK_IO(WriteObject(v,up,write,lvi._name));
        _CHECK_IO(SafeWrite(v,write,up,&lvi._pos,sizeof(SQUnsignedInteger)));
        _CHECK_IO(SafeWrite(v,write,up,&lvi._start_op,sizeof(SQUnsignedInteger)));
        _CHECK_IO(SafeWrite(v,write,up,&lvi._end_op,sizeof(SQUnsignedInteger)));
    }

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeWrite(v,write,up,_lineinfos,sizeof(SQLineInfo)*nlineinfos));

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeWrite(v,write,up,_defaultparams,sizeof(SQInteger)*ndefaultparams));

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeWrite(v,write,up,_instructions,sizeof(SQInstruction)*ninstructions));

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<nfunctions;i++){
        _CHECK_IO(_funcproto(_functions[i])->Save(v,up,write));
    }
    _CHECK_IO(SafeWrite(v,write,up,&_stacksize,sizeof(_stacksize)));
    _CHECK_IO(SafeWrite(v,write,up,&_bgenerator,sizeof(_bgenerator)));
    _CHECK_IO(SafeWrite(v,write,up,&_varparams,sizeof(_varparams)));
    return true;
}